

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

Interval * __thiscall
vkt::shaderexecutor::Functions::Div::applyPoint
          (Interval *__return_storage_ptr__,Div *this,EvalContext *ctx,double x,double y)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  Interval dst;
  Interval local_30;
  
  FloatFunc2::applyPoint(__return_storage_ptr__,(FloatFunc2 *)this,ctx,x,y);
  if (x < -1.79769313486232e+308 == x <= 1.79769313486232e+308) {
    return __return_storage_ptr__;
  }
  if ((y == 0.0) && (!NAN(y))) {
    return __return_storage_ptr__;
  }
  if (y <= 1.79769313486232e+308 == y < -1.79769313486232e+308) {
    return __return_storage_ptr__;
  }
  tcu::FloatFormat::convert(&local_30,&ctx->format,__return_storage_ptr__);
  dVar4 = -INFINITY;
  if ((-INFINITY < local_30.m_lo) || (NAN(local_30.m_hi))) goto LAB_008bd5cb;
  dVar5 = (ctx->format).m_maxValue;
  dVar7 = -dVar5;
  bVar1 = NAN(dVar5);
  if (bVar1) {
    dVar6 = INFINITY;
    if (!bVar1) goto LAB_008bd57b;
  }
  else {
    dVar6 = dVar7;
    if (!bVar1 && !NAN(dVar5)) {
LAB_008bd57b:
      dVar4 = dVar7;
    }
  }
  uVar2 = -(ulong)(__return_storage_ptr__->m_lo <= dVar6);
  uVar3 = -(ulong)(dVar4 <= __return_storage_ptr__->m_hi);
  __return_storage_ptr__->m_hasNaN = (bool)(bVar1 | __return_storage_ptr__->m_hasNaN & 1U);
  __return_storage_ptr__->m_lo =
       (double)(uVar2 & (ulong)__return_storage_ptr__->m_lo | ~uVar2 & (ulong)dVar6);
  __return_storage_ptr__->m_hi =
       (double)(uVar3 & (ulong)__return_storage_ptr__->m_hi | ~uVar3 & (ulong)dVar4);
LAB_008bd5cb:
  if ((!NAN(local_30.m_lo)) && (INFINITY <= local_30.m_hi)) {
    dVar4 = (ctx->format).m_maxValue;
    bVar1 = NAN(dVar4);
    dVar5 = dVar4;
    if (bVar1) {
      dVar4 = -INFINITY;
      dVar5 = INFINITY;
    }
    uVar2 = -(ulong)(__return_storage_ptr__->m_lo <= dVar5);
    uVar3 = -(ulong)(dVar4 <= __return_storage_ptr__->m_hi);
    __return_storage_ptr__->m_hasNaN = (bool)(bVar1 | __return_storage_ptr__->m_hasNaN & 1U);
    __return_storage_ptr__->m_lo =
         (double)(uVar2 & (ulong)__return_storage_ptr__->m_lo | ~uVar2 & (ulong)dVar5);
    __return_storage_ptr__->m_hi =
         (double)(uVar3 & (ulong)__return_storage_ptr__->m_hi | ~uVar3 & (ulong)dVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

Interval	applyPoint		(const EvalContext&	ctx, double x, double y) const
	{
		Interval ret = FloatFunc2::applyPoint(ctx, x, y);

		if (!deIsInf(x) && !deIsInf(y) && y != 0.0)
		{
			const Interval dst = ctx.format.convert(ret);
			if (dst.contains(-TCU_INFINITY)) ret |= -ctx.format.getMaxValue();
			if (dst.contains(+TCU_INFINITY)) ret |= +ctx.format.getMaxValue();
		}

		return ret;
	}